

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineLayoutVk.hpp
# Opt level: O3

Uint32 __thiscall
Diligent::PipelineLayoutVk::GetFirstDescrSetIndex(PipelineLayoutVk *this,Uint32 Index)

{
  char (*in_RCX) [27];
  string msg;
  string local_38;
  
  if (this->m_DbgMaxBindIndex < Index) {
    FormatString<char[26],char[27]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Index <= m_DbgMaxBindIndex",in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetFirstDescrSetIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/PipelineLayoutVk.hpp"
               ,0x3a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return (Uint32)(this->m_FirstDescrSetIndex)._M_elems[Index];
}

Assistant:

Uint32 GetFirstDescrSetIndex(Uint32 Index) const
    {
        VERIFY_EXPR(Index <= m_DbgMaxBindIndex);
        return m_FirstDescrSetIndex[Index];
    }